

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O1

string * __thiscall
cmExportTryCompileFileGenerator::GetFileSetFiles_abi_cxx11_
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,
          cmGeneratorTarget *param_1,cmFileSet *fileSet,cmTargetExport *param_3)

{
  WrapQuotes wrapQuotes;
  string_view separator;
  string_view str;
  string local_30;
  
  wrapQuotes = (WrapQuotes)param_3;
  separator._M_str = ";";
  separator._M_len = 1;
  cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
            (&local_30,&fileSet->FileEntries,separator);
  str._M_str = (char *)0x0;
  str._M_len = (size_t)local_30._M_dataplus._M_p;
  cmOutputConverter::EscapeForCMake_abi_cxx11_
            (__return_storage_ptr__,(cmOutputConverter *)local_30._M_string_length,str,wrapQuotes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::GetFileSetFiles(
  cmGeneratorTarget* /*gte*/, cmFileSet* fileSet, cmTargetExport* /*te*/)
{
  return cmOutputConverter::EscapeForCMake(
    cmJoin(fileSet->GetFileEntries(), ";"));
}